

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ErrorWithMsg(sqlite3 *db,int err_code,char *zFormat,...)

{
  char in_AL;
  sqlite3_value *psVar1;
  char *pcVar2;
  undefined8 in_RCX;
  _func_void_void_ptr *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  _func_void_void_ptr *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  db->errCode = err_code;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  sqlite3SystemError(db,err_code);
  if (zFormat != (char *)0x0) {
    if (db->pErr == (sqlite3_value *)0x0) {
      psVar1 = sqlite3ValueNew(db);
      db->pErr = psVar1;
      if (psVar1 == (sqlite3_value *)0x0) {
        return;
      }
    }
    ap[0].reg_save_area = local_c8;
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].gp_offset = 0x18;
    ap[0].fp_offset = 0x30;
    pcVar2 = sqlite3VMPrintf(db,zFormat,ap);
    sqlite3ValueSetStr(db->pErr,(int)pcVar2,(void *)0x1,0x91,in_R8);
    return;
  }
  sqlite3Error(db,err_code);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ErrorWithMsg(sqlite3 *db, int err_code, const char *zFormat, ...){
  assert( db!=0 );
  db->errCode = err_code;
  sqlite3SystemError(db, err_code);
  if( zFormat==0 ){
    sqlite3Error(db, err_code);
  }else if( db->pErr || (db->pErr = sqlite3ValueNew(db))!=0 ){
    char *z;
    va_list ap;
    va_start(ap, zFormat);
    z = sqlite3VMPrintf(db, zFormat, ap);
    va_end(ap);
    sqlite3ValueSetStr(db->pErr, -1, z, SQLITE_UTF8, SQLITE_DYNAMIC);
  }
}